

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
Tools::stringvec_to_doublevec
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringvec)

{
  pointer pbVar1;
  pointer pdVar2;
  pointer __str;
  double dVar3;
  allocator_type aaStack_48 [32];
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)(stringvec->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(stringvec->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,aaStack_48);
  pbVar1 = (stringvec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (__str = (stringvec->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __str != pbVar1; __str = __str + 1) {
    dVar3 = std::__cxx11::stod(__str,(size_t *)0x0);
    *pdVar2 = dVar3;
    pdVar2 = pdVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Tools::stringvec_to_doublevec(std::vector<std::string> stringvec) {
    std::vector<double> doublevec(stringvec.size());
    std::transform(stringvec.begin(), stringvec.end(), doublevec.begin(), [](const std::string &val) {
        try {
            return std::stod(val);
        }
        catch (const std::invalid_argument &ia) {
            throw std::invalid_argument("invalid argument: " + val);
        }
    });
    return doublevec;
}